

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O0

OPJ_BOOL bmp_read_raw_data(FILE *IN,OPJ_UINT8 *pData,OPJ_UINT32 stride,OPJ_UINT32 width,
                          OPJ_UINT32 height)

{
  size_t sVar1;
  bool bVar2;
  OPJ_UINT32 height_local;
  OPJ_UINT32 width_local;
  OPJ_UINT32 stride_local;
  OPJ_UINT8 *pData_local;
  FILE *IN_local;
  
  sVar1 = fread(pData,1,(ulong)(stride * height),(FILE *)IN);
  bVar2 = sVar1 == stride * height;
  if (!bVar2) {
    fprintf(_stderr,"\nError: fread return a number of element different from the expected.\n");
  }
  IN_local._4_4_ = (uint)bVar2;
  return IN_local._4_4_;
}

Assistant:

static OPJ_BOOL bmp_read_raw_data(FILE* IN, OPJ_UINT8* pData, OPJ_UINT32 stride,
                                  OPJ_UINT32 width, OPJ_UINT32 height)
{
    OPJ_ARG_NOT_USED(width);

    if (fread(pData, sizeof(OPJ_UINT8), stride * height, IN) != (stride * height)) {
        fprintf(stderr,
                "\nError: fread return a number of element different from the expected.\n");
        return OPJ_FALSE;
    }
    return OPJ_TRUE;
}